

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# query_profiler.cpp
# Opt level: O1

void __thiscall
duckdb::OperatorProfiler::OperatorProfiler(OperatorProfiler *this,ClientContext *context)

{
  profiler_settings_t *settings;
  type this_00;
  type pQVar1;
  bool bVar2;
  __hashtable *__h;
  __node_base _Var3;
  _Hash_node_base *p_Var4;
  MetricsType metric;
  profiler_settings_t root_metrics;
  undefined4 local_68;
  undefined1 local_64;
  undefined1 local_63;
  undefined1 local_62;
  undefined1 local_61;
  _Hashtable<duckdb::MetricsType,_duckdb::MetricsType,_std::allocator<duckdb::MetricsType>,_std::__detail::_Identity,_std::equal_to<duckdb::MetricsType>,_duckdb::MetricsTypeHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  local_60;
  
  this->context = context;
  settings = &this->settings;
  (this->settings)._M_h._M_buckets = &(this->settings)._M_h._M_single_bucket;
  (this->settings)._M_h._M_bucket_count = 1;
  (this->settings)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->settings)._M_h._M_element_count = 0;
  (this->settings)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->active_operator).ptr = (PhysicalOperator *)0x0;
  (this->settings)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->settings)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->op).start.__d.__r = 0;
  (this->op).end.__d.__r = 0;
  (this->op).finished = false;
  (this->operator_infos)._M_h._M_buckets = &(this->operator_infos)._M_h._M_single_bucket;
  (this->operator_infos)._M_h._M_bucket_count = 1;
  (this->operator_infos)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->operator_infos)._M_h._M_element_count = 0;
  (this->operator_infos)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->operator_infos)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->operator_infos)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  this_00 = unique_ptr<duckdb::ClientData,_std::default_delete<duckdb::ClientData>,_true>::operator*
                      (&context->client_data);
  pQVar1 = shared_ptr<duckdb::QueryProfiler,_true>::operator*(&this_00->profiler);
  bVar2 = true;
  if (pQVar1->is_explain_analyze == false) {
    bVar2 = (pQVar1->context->config).enable_profiler;
  }
  this->enabled = bVar2;
  p_Var4 = (context->config).profiler_settings._M_h._M_before_begin._M_nxt;
  if (p_Var4 != (_Hash_node_base *)0x0) {
    do {
      local_68 = CONCAT31(local_68._1_3_,*(undefined1 *)&p_Var4[1]._M_nxt);
      local_60._M_buckets = (__buckets_ptr)settings;
      ::std::
      _Hashtable<duckdb::MetricsType,duckdb::MetricsType,std::allocator<duckdb::MetricsType>,std::__detail::_Identity,std::equal_to<duckdb::MetricsType>,duckdb::MetricsTypeHashFunction,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
      ::
      _M_insert<duckdb::MetricsType_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<duckdb::MetricsType,true>>>>
                ((_Hashtable<duckdb::MetricsType,duckdb::MetricsType,std::allocator<duckdb::MetricsType>,std::__detail::_Identity,std::equal_to<duckdb::MetricsType>,duckdb::MetricsTypeHashFunction,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                  *)settings,&local_68,&local_60);
      ProfilingInfo::Expand(settings,(MetricsType)local_68);
      p_Var4 = p_Var4->_M_nxt;
    } while (p_Var4 != (_Hash_node_base *)0x0);
  }
  local_68 = 0xc0b0100;
  ::std::
  _Hashtable<duckdb::MetricsType,duckdb::MetricsType,std::allocator<duckdb::MetricsType>,std::__detail::_Identity,std::equal_to<duckdb::MetricsType>,duckdb::MetricsTypeHashFunction,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
  ::_Hashtable<duckdb::MetricsType_const*>
            ((_Hashtable<duckdb::MetricsType,duckdb::MetricsType,std::allocator<duckdb::MetricsType>,std::__detail::_Identity,std::equal_to<duckdb::MetricsType>,duckdb::MetricsTypeHashFunction,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
              *)&local_60,&local_68,&local_64,0,&local_61,&local_62,&local_63);
  if (local_60._M_before_begin._M_nxt != (_Hash_node_base *)0x0) {
    _Var3._M_nxt = local_60._M_before_begin._M_nxt;
    do {
      local_68 = CONCAT31(local_68._1_3_,*(undefined1 *)&_Var3._M_nxt[1]._M_nxt);
      ::std::
      _Hashtable<duckdb::MetricsType,_duckdb::MetricsType,_std::allocator<duckdb::MetricsType>,_std::__detail::_Identity,_std::equal_to<duckdb::MetricsType>,_duckdb::MetricsTypeHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
      ::_M_erase(&settings->_M_h,&local_68);
      _Var3._M_nxt = (_Var3._M_nxt)->_M_nxt;
    } while (_Var3._M_nxt != (_Hash_node_base *)0x0);
  }
  ::std::
  _Hashtable<duckdb::MetricsType,_duckdb::MetricsType,_std::allocator<duckdb::MetricsType>,_std::__detail::_Identity,_std::equal_to<duckdb::MetricsType>,_duckdb::MetricsTypeHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable(&local_60);
  return;
}

Assistant:

OperatorProfiler::OperatorProfiler(ClientContext &context) : context(context) {
	enabled = QueryProfiler::Get(context).IsEnabled();
	auto &context_metrics = ClientConfig::GetConfig(context).profiler_settings;

	// Expand.
	for (const auto metric : context_metrics) {
		settings.insert(metric);
		ProfilingInfo::Expand(settings, metric);
	}

	// Reduce.
	auto root_metrics = ProfilingInfo::DefaultRootSettings();
	for (const auto metric : root_metrics) {
		settings.erase(metric);
	}
}